

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O1

Sexp * GcHeap::AllocateMeaning(Meaning *meaning)

{
  Sexp *pSVar1;
  
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x11f,"static Sexp *GcHeap::AllocateMeaning(Meaning *)");
  }
  if (meaning != (Meaning *)0x0) {
    pSVar1 = Allocate(g_heap,false);
    if (pSVar1 != (Sexp *)0x0) {
      pSVar1->kind = MEANING;
      (pSVar1->field_1).meaning = meaning;
      return pSVar1;
    }
    __assert_fail("s != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0x123,"static Sexp *GcHeap::AllocateMeaning(Meaning *)");
  }
  __assert_fail("meaning != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0x120,"static Sexp *GcHeap::AllocateMeaning(Meaning *)");
}

Assistant:

static Sexp *AllocateMeaning(Meaning *meaning) {
    assert(g_heap != nullptr);
    assert(meaning != nullptr);
    // TODO(segilles) fix the leak
    Sexp *s = g_heap->Allocate(false);
    assert(s != nullptr);
    s->kind = Sexp::Kind::MEANING;
    s->meaning = meaning;
    return s;
  }